

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O1

error_code __thiscall simdjson::dom::parser::allocate(parser *this,size_t capacity,size_t max_depth)

{
  dom_parser_implementation *pdVar1;
  error_code eVar2;
  
  pdVar1 = (this->implementation)._M_t.
           super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
           ._M_t.
           super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
           .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
           _M_head_impl;
  if (pdVar1 == (dom_parser_implementation *)0x0) {
    eVar2 = (**(code **)(*active_implementation + 0x18))
                      (active_implementation,capacity,max_depth,&this->implementation);
    return eVar2;
  }
  if (((pdVar1->_max_depth == max_depth) ||
      (eVar2 = (*pdVar1->_vptr_dom_parser_implementation[5])(pdVar1,max_depth), eVar2 == SUCCESS))
     && ((pdVar1->_capacity == capacity ||
         (eVar2 = (*pdVar1->_vptr_dom_parser_implementation[4])(pdVar1,capacity), eVar2 == SUCCESS))
        )) {
    eVar2 = SUCCESS;
  }
  return eVar2;
}

Assistant:

simdjson_warn_unused
inline error_code parser::allocate(size_t capacity, size_t max_depth) noexcept {
  //
  // Reallocate implementation if needed
  //
  error_code err;
  if (implementation) {
    err = implementation->allocate(capacity, max_depth);
  } else {
    err = simdjson::active_implementation->create_dom_parser_implementation(capacity, max_depth, implementation);
  }
  if (err) { return err; }
  return SUCCESS;
}